

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

ini_t * ini_create(void *memctx)

{
  ini_t *piVar1;
  ini_internal_section_t *piVar2;
  ini_internal_property_t *piVar3;
  ini_t *ini;
  void *memctx_local;
  
  piVar1 = (ini_t *)sx__malloc((sx_alloc *)memctx,0x28,0,(char *)0x0,(char *)0x0,0);
  piVar1->memctx = memctx;
  piVar2 = (ini_internal_section_t *)
           sx__malloc((sx_alloc *)piVar1->memctx,0x2800,0,(char *)0x0,(char *)0x0,0);
  piVar1->sections = piVar2;
  piVar1->section_capacity = 0x100;
  piVar1->section_count = 1;
  piVar1->sections->name[0] = '\0';
  piVar1->sections->name_large = (char *)0x0;
  piVar3 = (ini_internal_property_t *)
           sx__malloc((sx_alloc *)piVar1->memctx,0x7800,0,(char *)0x0,(char *)0x0,0);
  piVar1->properties = piVar3;
  piVar1->property_capacity = 0x100;
  piVar1->property_count = 0;
  return piVar1;
}

Assistant:

ini_t* ini_create( void* memctx )
    {
    ini_t* ini;

    ini = (ini_t*) INI_MALLOC( memctx, sizeof( ini_t ) );
    ini->memctx = memctx;
    ini->sections = (struct ini_internal_section_t*) INI_MALLOC( ini->memctx, INITIAL_CAPACITY * sizeof( ini->sections[ 0 ] ) );
    ini->section_capacity = INITIAL_CAPACITY;
    ini->section_count = 1; /* global section */
    ini->sections[ 0 ].name[ 0 ] = '\0'; 
    ini->sections[ 0 ].name_large = 0;
    ini->properties = (struct ini_internal_property_t*) INI_MALLOC( ini->memctx, INITIAL_CAPACITY * sizeof( ini->properties[ 0 ] ) );
    ini->property_capacity = INITIAL_CAPACITY;
    ini->property_count = 0;
    return ini;
    }